

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall
QWidgetWindow::handleWindowStateChangedEvent(QWidgetWindow *this,QWindowStateChangeEvent *event)

{
  Int IVar1;
  QWidget *pQVar2;
  QWidgetWindow *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  WindowStates windowState;
  WindowStates widgetState;
  WindowStates eventState;
  QWindowStateChangeEvent widgetEvent;
  WindowState in_stack_ffffffffffffff9c;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffa8;
  QFlagsStorageHelper<Qt::WindowState,_4> local_34;
  QFlagsStorageHelper<Qt::WindowState,_4> local_30;
  undefined4 local_2c;
  QFlagsStorage<Qt::WindowState> local_28;
  QFlagsStorage<Qt::WindowState> local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.i = 0xaaaaaaaa;
  local_24.i = (Int)QWindowStateChangeEvent::oldState((QWindowStateChangeEvent *)in_RDI);
  local_28.i = 0xaaaaaaaa;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6b5a);
  local_28.i = (Int)QWidget::windowState(in_RDI);
  local_2c = 0xaaaaaaaa;
  local_2c = QWindow::windowStates();
  local_30.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       QFlags<Qt::WindowState>::operator&
                 ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
  if (IVar1 != 0) {
    QFlags<Qt::WindowState>::operator|=((QFlags<Qt::WindowState> *)&local_24,WindowActive);
  }
  local_34.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       QFlags<Qt::WindowState>::operator&
                 ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
  if (IVar1 == 0) {
    QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
    local_28.i = (Int)QFlags<Qt::WindowState>::operator|
                                ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffffa8.i);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar1 != 0) {
      updateNormalGeometry(in_RSI);
    }
  }
  else {
    QFlags<Qt::WindowState>::operator|=((QFlags<Qt::WindowState> *)&local_28,WindowMinimized);
  }
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
  pQVar2 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6c46);
  if (IVar1 != (*(uint *)&pQVar2->data->field_0x10 & 0xf)) {
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
    pQVar2 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6c7a);
    *(uint *)&pQVar2->data->field_0x10 =
         *(uint *)&pQVar2->data->field_0x10 & 0xfffffff0 | IVar1 & 0xf;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              ((QWindowStateChangeEvent *)&local_20,(QFlags_conflict1 *)(ulong)local_24.i,false);
    pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b6cd9);
    QCoreApplication::forwardEvent(&pQVar2->super_QObject,(QEvent *)&local_20,(QEvent *)in_RSI);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleWindowStateChangedEvent(QWindowStateChangeEvent *event)
{
    // QWindow does currently not know 'active'.
    Qt::WindowStates eventState = event->oldState();
    Qt::WindowStates widgetState = m_widget->windowState();
    Qt::WindowStates windowState = windowStates();
    if (widgetState & Qt::WindowActive)
        eventState |= Qt::WindowActive;

    // Determine the new widget state, remember maximized/full screen
    // during minimized.
    if (windowState & Qt::WindowMinimized) {
        widgetState |= Qt::WindowMinimized;
    } else {
        widgetState = windowState | (widgetState & Qt::WindowActive);
        if (windowState) // Maximized or FullScreen
            updateNormalGeometry();
    }

    // Sent event if the state changed (that is, it is not triggered by
    // QWidget::setWindowState(), which also sends an event to the widget).
    if (widgetState != Qt::WindowStates::Int(m_widget->data->window_state)) {
        m_widget->data->window_state = uint(widgetState);
        QWindowStateChangeEvent widgetEvent(eventState);
        QGuiApplication::forwardEvent(m_widget, &widgetEvent, event);
    }
}